

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  string *this_00;
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  element_type *peVar3;
  pointer ppVar4;
  pointer ppVar5;
  size_t sVar6;
  size_t __n;
  bool bVar7;
  type_conflict1 tVar8;
  int iVar9;
  App *this_01;
  Option *this_02;
  Option *pOVar10;
  int64_t iVar11;
  int *piVar12;
  InvalidError *this_03;
  ConfigError *__return_storage_ptr__;
  ArgumentMismatch *__return_storage_ptr___00;
  ConversionError *__return_storage_ptr___01;
  Classifier CVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  _Alloc_hider _Var14;
  pointer pbVar15;
  results_t *prVar16;
  ulong uVar17;
  pointer ppVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool bVar19;
  string res;
  undefined1 local_2a0 [32];
  results_t *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  pointer local_270;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  string local_190;
  string local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar15 = (item->parents).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5)) {
    _Var14._M_p = pbVar15[level]._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,_Var14._M_p,_Var14._M_p + pbVar15[level]._M_string_length);
    this_01 = _find_subcommand(this,&local_50,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (this_01 == (App *)0x0) {
      return false;
    }
    bVar7 = _parse_single_config(this_01,item,level + 1);
    return bVar7;
  }
  this_00 = &item->name;
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,"++");
  if (iVar9 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    increment_parsed(this);
    _trigger_pre_parse(this,2);
    if (this->parent_ != (App *)0x0) {
      local_2a0._0_8_ = this;
      ::std::vector<CLI::App*,std::allocator<CLI::App*>>::emplace_back<CLI::App*>
                ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parent_->parsed_subcommands_,
                 (App **)local_2a0);
      return true;
    }
    return true;
  }
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,"--");
  if (iVar9 == 0) {
    if (this->configurable_ != true) {
      return true;
    }
    if ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      _process_callbacks(this);
      _process_requirements(this);
      run_callback(this,false,false);
      return true;
    }
    return true;
  }
  ::std::operator+(&local_70,"--",this_00);
  this_02 = get_option_no_throw(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (this_02 == (Option *)0x0) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_90,"-",this_00);
      this_02 = get_option_no_throw(this,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      this_02 = (Option *)0x0;
    }
    if (this_02 == (Option *)0x0) {
      pcVar1 = (item->name)._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + (item->name)._M_string_length);
      this_02 = get_option_no_throw(this,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else if ((this_02->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      pcVar1 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + (item->name)._M_string_length);
      pOVar10 = get_option_no_throw(this,&local_f0);
      _Var14._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_001c03b5;
      goto LAB_001c03bd;
    }
  }
  else if ((this_02->super_OptionBase<CLI::Option>).configurable_ == false) {
    if ((item->name)._M_string_length == 1) {
      ::std::operator+(&local_d0,"-",this_00);
      pOVar10 = get_option_no_throw(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((pOVar10 != (Option *)0x0) &&
         ((pOVar10->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_02 = pOVar10;
      }
    }
    if ((this_02->super_OptionBase<CLI::Option>).configurable_ == false) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      pcVar1 = (item->name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + (item->name)._M_string_length);
      pOVar10 = get_option_no_throw(this,&local_110);
      local_f0.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
      _Var14._M_p = local_110._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
LAB_001c03b5:
        operator_delete(_Var14._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
LAB_001c03bd:
      if ((pOVar10 != (Option *)0x0) &&
         ((pOVar10->super_OptionBase<CLI::Option>).configurable_ != false)) {
        this_02 = pOVar10;
      }
    }
  }
  if (this_02 == (Option *)0x0) {
    if (this->allow_config_extras_ == capture) {
      local_1c8._M_dataplus._M_p._0_4_ = 0;
      ConfigItem::fullname_abi_cxx11_((string *)local_2a0,item);
      ::std::
      vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
      ::emplace_back<CLI::detail::Classifier,std::__cxx11::string>
                ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                  *)&this->missing_,(Classifier *)&local_1c8,(string *)local_2a0);
      if ((App *)local_2a0._0_8_ != (App *)(local_2a0 + 0x10)) {
        operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
      }
      __args_1 = (item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (item->inputs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__args_1 != pbVar2) {
        do {
          local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffff00000000;
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&this->missing_,(Classifier *)local_2a0,__args_1);
          __args_1 = __args_1 + 1;
        } while (__args_1 != pbVar2);
        return false;
      }
    }
    return false;
  }
  if ((this_02->super_OptionBase<CLI::Option>).configurable_ == false) {
    if (this->allow_config_extras_ == ignore_all) {
      return false;
    }
    __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
    ConfigItem::fullname_abi_cxx11_(&local_130,item);
    ConfigError::NotConfigurable(__return_storage_ptr__,&local_130);
    __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
  }
  if ((this_02->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_02->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return true;
  }
  prVar16 = &this_02->results_;
  if (this_02->expected_min_ != 0) {
LAB_001c0455:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1a8,&item->inputs);
    this_02->current_option_state_ = parsing;
    for (; local_1a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_1a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      Option::_add_result(this_02,local_1a8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,prVar16);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
    Option::run_callback(this_02);
    return true;
  }
  uVar17 = (long)(item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(item->inputs).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_280 = prVar16;
  if (1 < uVar17) {
    local_2a0._0_4_ = this_02->type_size_max_;
    tVar8 = CLI::detail::checked_multiply<int>((int *)local_2a0,this_02->expected_max_);
    CVar13 = 0x20000000;
    if (tVar8) {
      CVar13 = local_2a0._0_4_;
    }
    prVar16 = local_280;
    if (((int)CVar13 < (int)uVar17) &&
       ((this_02->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeAll)) {
      local_2a0._0_4_ = this_02->type_size_max_;
      tVar8 = CLI::detail::checked_multiply<int>((int *)local_2a0,this_02->expected_max_);
      if ((!tVar8) || (1 < (int)local_2a0._0_4_)) {
        __return_storage_ptr___00 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_170,item);
        local_2a0._0_4_ = this_02->type_size_max_;
        tVar8 = CLI::detail::checked_multiply<int>((int *)local_2a0,this_02->expected_max_);
        CVar13 = 0x20000000;
        if (tVar8) {
          CVar13 = local_2a0._0_4_;
        }
        ArgumentMismatch::AtMost
                  (__return_storage_ptr___00,&local_170,CVar13,
                   (long)(item->inputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(item->inputs).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        __cxa_throw(__return_storage_ptr___00,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      if ((this_02->super_OptionBase<CLI::Option>).disable_flag_override_ == false) {
        __return_storage_ptr___01 = (ConversionError *)__cxa_allocate_exception(0x38);
        ConfigItem::fullname_abi_cxx11_(&local_190,item);
        ConversionError::TooManyInputsFlag(__return_storage_ptr___01,&local_190);
        __cxa_throw(__return_storage_ptr___01,&ConversionError::typeinfo,Error::~Error);
      }
      pbVar15 = (item->inputs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_270 = (item->inputs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar15 == local_270) {
        return true;
      }
      do {
        ppVar4 = (this_02->default_flag_values_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (this_02->default_flag_values_).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar4 == ppVar5) {
          iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(pbVar15,"true");
          if ((((iVar9 != 0) &&
               (iVar9 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (pbVar15,"false"), iVar9 != 0)) &&
              (iVar9 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (pbVar15,"1"), iVar9 != 0)) &&
             (iVar9 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (pbVar15,"0"), iVar9 != 0)) goto LAB_001c0864;
        }
        else {
          sVar6 = pbVar15->_M_string_length;
          bVar7 = false;
          local_278 = pbVar15;
          do {
            ppVar18 = ppVar4 + 1;
            __n = (ppVar4->second)._M_string_length;
            if (__n == sVar6) {
              if (__n == 0) {
                bVar19 = true;
              }
              else {
                iVar9 = bcmp((ppVar4->second)._M_dataplus._M_p,(local_278->_M_dataplus)._M_p,__n);
                bVar19 = iVar9 == 0;
              }
            }
            else {
              bVar19 = false;
            }
            if (bVar19) {
              bVar7 = true;
              break;
            }
            ppVar4 = ppVar18;
          } while (ppVar18 != ppVar5);
          pbVar15 = local_278;
          if (!bVar7) {
LAB_001c0864:
            this_03 = (InvalidError *)__cxa_allocate_exception(0x38);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"invalid flag argument given","");
            InvalidError::InvalidError(this_03,&local_1e8);
            __cxa_throw(this_03,&InvalidError::typeinfo,Error::~Error);
          }
        }
        pcVar1 = (pbVar15->_M_dataplus)._M_p;
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar1,pcVar1 + pbVar15->_M_string_length);
        Option::_add_result(this_02,&local_268,local_280);
        this_02->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        pbVar15 = pbVar15 + 1;
        if (pbVar15 == local_270) {
          return true;
        }
      } while( true );
    }
    goto LAB_001c0455;
  }
  peVar3 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar3->_vptr_Config[2])(local_2a0,peVar3,item);
  if ((this_02->super_OptionBase<CLI::Option>).disable_flag_override_ == true) {
    local_150._M_allocated_capacity = (size_type)&local_140;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
    iVar11 = CLI::detail::to_flag_value((string *)&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_allocated_capacity != &local_140) {
      operator_delete((void *)local_150._M_allocated_capacity,local_140._M_allocated_capacity + 1);
    }
    if (iVar11 == 1) {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"{}","");
      prVar16 = local_280;
      Option::get_flag_value(&local_1c8,this_02,this_00,&local_208);
      _parse_single_config();
      goto LAB_001c0624;
    }
  }
  piVar12 = __errno_location();
  *piVar12 = 0;
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     "{}");
  prVar16 = local_280;
  if ((iVar9 != 0) || (this_02->expected_max_ < 2)) {
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
    Option::get_flag_value(&local_1c8,this_02,this_00,&local_228);
    _parse_single_config();
  }
LAB_001c0624:
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,local_2a0._0_8_,(pointer)(local_2a0._0_8_ + local_2a0._8_8_));
  Option::_add_result(this_02,&local_248,prVar16);
  this_02->current_option_state_ = parsing;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((App *)local_2a0._0_8_ != (App *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
    return true;
  }
  return true;
}

Assistant:

CLI11_INLINE bool App::_parse_single_config(const ConfigItem &item, std::size_t level) {

    if(level < item.parents.size()) {
        auto *subcom = get_subcommand_no_throw(item.parents.at(level));
        return (subcom != nullptr) ? subcom->_parse_single_config(item, level + 1) : false;
    }
    // check for section open
    if(item.name == "++") {
        if(configurable_) {
            increment_parsed();
            _trigger_pre_parse(2);
            if(parent_ != nullptr) {
                parent_->parsed_subcommands_.push_back(this);
            }
        }
        return true;
    }
    // check for section close
    if(item.name == "--") {
        if(configurable_ && parse_complete_callback_) {
            _process_callbacks();
            _process_requirements();
            run_callback();
        }
        return true;
    }
    Option *op = get_option_no_throw("--" + item.name);
    if(op == nullptr) {
        if(item.name.size() == 1) {
            op = get_option_no_throw("-" + item.name);
        }
        if(op == nullptr) {
            op = get_option_no_throw(item.name);
        } else if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    } else if(!op->get_configurable()) {
        if(item.name.size() == 1) {
            auto *testop = get_option_no_throw("-" + item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
        if(!op->get_configurable()) {
            auto *testop = get_option_no_throw(item.name);
            if(testop != nullptr && testop->get_configurable()) {
                op = testop;
            }
        }
    }

    if(op == nullptr) {
        // If the option was not present
        if(get_allow_config_extras() == config_extras_mode::capture) {
            // Should we worry about classifying the extras properly?
            missing_.emplace_back(detail::Classifier::NONE, item.fullname());
            for(const auto &input : item.inputs) {
                missing_.emplace_back(detail::Classifier::NONE, input);
            }
        }
        return false;
    }

    if(!op->get_configurable()) {
        if(get_allow_config_extras() == config_extras_mode::ignore_all) {
            return false;
        }
        throw ConfigError::NotConfigurable(item.fullname());
    }

    if(op->empty()) {

        if(op->get_expected_min() == 0) {
            if(item.inputs.size() <= 1) {
                // Flag parsing
                auto res = config_formatter_->to_flag(item);
                bool converted{false};
                if(op->get_disable_flag_override()) {
                    auto val = detail::to_flag_value(res);
                    if(val == 1) {
                        res = op->get_flag_value(item.name, "{}");
                        converted = true;
                    }
                }

                if(!converted) {
                    errno = 0;
                    if(res != "{}" || op->get_expected_max() <= 1) {
                        res = op->get_flag_value(item.name, res);
                    }
                }

                op->add_result(res);
                return true;
            }
            if(static_cast<int>(item.inputs.size()) > op->get_items_expected_max() &&
               op->get_multi_option_policy() != MultiOptionPolicy::TakeAll) {
                if(op->get_items_expected_max() > 1) {
                    throw ArgumentMismatch::AtMost(item.fullname(), op->get_items_expected_max(), item.inputs.size());
                }

                if(!op->get_disable_flag_override()) {
                    throw ConversionError::TooManyInputsFlag(item.fullname());
                }
                // if the disable flag override is set then we must have the flag values match a known flag value
                // this is true regardless of the output value, so an array input is possible and must be accounted for
                for(const auto &res : item.inputs) {
                    bool valid_value{false};
                    if(op->default_flag_values_.empty()) {
                        if(res == "true" || res == "false" || res == "1" || res == "0") {
                            valid_value = true;
                        }
                    } else {
                        for(const auto &valid_res : op->default_flag_values_) {
                            if(valid_res.second == res) {
                                valid_value = true;
                                break;
                            }
                        }
                    }

                    if(valid_value) {
                        op->add_result(res);
                    } else {
                        throw InvalidError("invalid flag argument given");
                    }
                }
                return true;
            }
        }
        op->add_result(item.inputs);
        op->run_callback();
    }

    return true;
}